

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O2

bool __thiscall
google::protobuf::internal::ExtensionSet::MaybeNewExtension
          (ExtensionSet *this,int number,FieldDescriptor *descriptor,Extension **result)

{
  pair<std::_Rb_tree_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_bool>
  pVar1;
  pair<int,_google::protobuf::internal::ExtensionSet::Extension> local_30;
  
  local_30.second.field_0.int64_value = 0;
  local_30.second.type = '\0';
  local_30.second.is_repeated = false;
  local_30.second._10_1_ = 0;
  local_30.second.is_packed = false;
  local_30.second.cached_size = 0;
  local_30.second.descriptor = (FieldDescriptor *)0x0;
  local_30.first = number;
  pVar1 = std::
          _Rb_tree<int,std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>,std::_Select1st<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>,std::less<int>,std::allocator<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>>
          ::_M_emplace_unique<std::pair<int,google::protobuf::internal::ExtensionSet::Extension>>
                    ((_Rb_tree<int,std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>,std::_Select1st<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>,std::less<int>,std::allocator<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>>
                      *)this,&local_30);
  *result = (Extension *)&pVar1.first._M_node._M_node[1]._M_parent;
  pVar1.first._M_node._M_node[1]._M_right = (_Base_ptr)descriptor;
  return (bool)(pVar1.second & 1);
}

Assistant:

bool ExtensionSet::MaybeNewExtension(int number,
                                     const FieldDescriptor* descriptor,
                                     Extension** result) {
  pair<map<int, Extension>::iterator, bool> insert_result =
      extensions_.insert(make_pair(number, Extension()));
  *result = &insert_result.first->second;
  (*result)->descriptor = descriptor;
  return insert_result.second;
}